

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointApplyDiff::test_method(PointApplyDiff *this)

{
  Index size;
  Index cols;
  int c;
  MatrixXd expectedRes;
  MatrixXd J;
  Index dim;
  MatrixXd Jf;
  undefined **local_2a0;
  undefined1 local_298;
  undefined8 *local_290;
  char **local_288;
  void *local_278;
  RealScalar local_260;
  undefined1 local_258;
  undefined8 local_250;
  shared_count sStack_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_200 [40];
  SO3<mnf::ExpMapMatrix> S;
  Point x;
  
  c = 5;
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&S);
  size = mnf::Manifold::dim();
  dim = size;
  cols = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random((RandomReturnType *)&x,5,cols)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Jf,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&x);
  mnf::Manifold::getZero();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random
            ((RandomReturnType *)&expectedRes,size);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&expectedRes,(type *)0x0);
  mnf::Point::retractation(&x,(Ref *)&x);
  free(local_288);
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  mnf::Point::diffRetractation();
  J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Jf,
                  (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2a0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (&expectedRes,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
              *)&J);
  free(local_2a0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>((Matrix<double,_1,_1,0,_1,_1> *)&J,&c,&dim);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_200,&J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&Jf,(type *)0x0);
  mnf::Point::applyDiffRetractation(&x,local_200,&local_2a0);
  free(local_278);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0xe8);
  local_260 = 1e-12;
  local_258 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
              ::run(&expectedRes,&J,&local_260);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_288 = &local_230;
  local_230 = "expectedRes.isApprox(J)";
  local_228 = "";
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_0013ec40;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_238 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  free(J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  mnf::Point::~Point(&x);
  free(Jf.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointApplyDiff)
{
  int c = 5;
  SO3<ExpMapMatrix> S;
  Index dim = S.dim();
  Index repDim = S.representationDim();
  Eigen::MatrixXd Jf = Eigen::MatrixXd::Random(c, repDim);
  Point x = S.getZero();
  x.retractation(x, Eigen::VectorXd::Random(dim));
  Eigen::MatrixXd expectedRes;
  expectedRes = Jf * x.diffRetractation();
  Eigen::MatrixXd J(c, dim);
  x.applyDiffRetractation(J, Jf);
  BOOST_CHECK(expectedRes.isApprox(J));
}